

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ImportModuleDependencies
               (ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,
               ByteCode *moduleBytecode)

{
  uint uVar1;
  ModuleData **ppMVar2;
  int iVar3;
  ExternModuleInfo *pEVar4;
  size_t sVar5;
  ModuleData **ppMVar6;
  ByteCode *pBVar7;
  Lexeme *lexStart;
  undefined4 extraout_var;
  Lexer *this;
  char *code;
  uint *puVar9;
  ulong uVar10;
  char *pcVar11;
  ModuleData *moduleData;
  uint lexStreamSize;
  TraceScope traceScope;
  ModuleData *local_98;
  ExpressionContext *local_90;
  uint local_84;
  ModuleContext *local_80;
  ByteCode *local_78;
  SynBase *local_70;
  SmallArray<ModuleData_*,_128U> *local_68;
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *local_60;
  InplaceStr local_58;
  char *local_48;
  TraceScope local_40;
  ModuleData *pMVar8;
  undefined4 extraout_var_00;
  
  local_90 = ctx;
  local_80 = moduleCtx;
  local_78 = moduleBytecode;
  local_70 = source;
  if (ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)::token == '\0')
  {
    iVar3 = __cxa_guard_acquire(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                                 ::token);
    if (iVar3 != 0) {
      ImportModuleDependencies::token = NULLC::TraceGetToken("analyze","ImportModuleDependencies");
      __cxa_guard_release(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                           ::token);
      moduleCtx = local_80;
      moduleBytecode = local_78;
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,ImportModuleDependencies::token);
  local_48 = FindSymbols(moduleBytecode);
  pEVar4 = FindFirstModule(moduleBytecode);
  if (moduleBytecode->dependsCount != 0) {
    local_60 = &local_90->uniqueDependencyMap;
    local_68 = &local_90->uniqueDependencies;
    puVar9 = &pEVar4->nameOffset;
    uVar10 = 0;
    do {
      pcVar11 = local_48 + *puVar9;
      local_58.begin = pcVar11;
      sVar5 = strlen(pcVar11);
      local_58.end = pcVar11 + sVar5;
      ppMVar6 = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
                          (local_60,&local_58);
      if (ppMVar6 == (ModuleData **)0x0) {
        pBVar7 = (ByteCode *)BinaryCache::FindBytecode(pcVar11,false);
        if (pBVar7 == (ByteCode *)0x0) {
          anon_unknown.dwarf_1117a3::Stop
                    (local_90,local_70,"ERROR: module dependency import is not implemented");
        }
        local_84 = 0;
        lexStart = BinaryCache::FindLexems(pcVar11,false,&local_84);
        iVar3 = (*local_90->allocator->_vptr_Allocator[2])(local_90->allocator,0x48);
        pMVar8 = (ModuleData *)CONCAT44(extraout_var,iVar3);
        sVar5 = strlen(pcVar11);
        pMVar8->source = local_70;
        (pMVar8->name).begin = pcVar11;
        (pMVar8->name).end = pcVar11 + sVar5;
        pMVar8->importIndex = 0;
        pMVar8->bytecode = (ByteCode *)0x0;
        pMVar8->lexer = (Lexer *)0x0;
        pMVar8->lexStream = (Lexeme *)0x0;
        pMVar8->lexStreamSize = 0;
        pMVar8->startingFunctionIndex = 0;
        pMVar8->importedFunctionCount = 0;
        pMVar8->moduleFunctionCount = 0;
        uVar1 = (local_80->dependencies).count;
        local_98 = pMVar8;
        if (uVar1 == (local_80->dependencies).max) {
          SmallArray<ModuleData_*,_32U>::grow(&local_80->dependencies,uVar1);
        }
        ppMVar6 = (local_80->dependencies).data;
        if (ppMVar6 == (ModuleData **)0x0) goto LAB_001fe800;
        uVar1 = (local_80->dependencies).count;
        (local_80->dependencies).count = uVar1 + 1;
        ppMVar6[uVar1] = local_98;
        uVar1 = (local_90->uniqueDependencies).count;
        if (uVar1 == (local_90->uniqueDependencies).max) {
          SmallArray<ModuleData_*,_128U>::grow(local_68,uVar1);
        }
        ppMVar6 = local_68->data;
        if (ppMVar6 == (ModuleData **)0x0) {
          pcVar11 = 
          "void SmallArray<ModuleData *, 128>::push_back(const T &) [T = ModuleData *, N = 128]";
          goto LAB_001fe82c;
        }
        uVar1 = (local_90->uniqueDependencies).count;
        (local_90->uniqueDependencies).count = uVar1 + 1;
        ppMVar6[uVar1] = local_98;
        local_58.begin = pcVar11;
        sVar5 = strlen(pcVar11);
        local_58.end = pcVar11 + sVar5;
        SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::insert
                  (local_60,&local_58,&local_98);
        local_98->bytecode = pBVar7;
        if (lexStart == (Lexeme *)0x0) {
          iVar3 = (*local_90->allocator->_vptr_Allocator[2])(local_90->allocator,0x420);
          this = (Lexer *)CONCAT44(extraout_var_00,iVar3);
          Lexer::Lexer(this,local_90->allocator);
          local_98->lexer = this;
          code = FindSource(local_98->bytecode);
          Lexer::Lexify(this,code);
          lexStart = Lexer::GetStreamStart(local_98->lexer);
          local_84 = Lexer::GetStreamSize(local_98->lexer);
          BinaryCache::PutLexemes(pcVar11,lexStart,local_84);
        }
        local_98->lexStream = lexStart;
        local_98->lexStreamSize = local_84;
        moduleCtx = local_80;
        moduleBytecode = local_78;
      }
      else {
        uVar1 = (moduleCtx->dependencies).count;
        if (uVar1 == (moduleCtx->dependencies).max) {
          SmallArray<ModuleData_*,_32U>::grow(&moduleCtx->dependencies,uVar1);
        }
        ppMVar2 = (moduleCtx->dependencies).data;
        if (ppMVar2 == (ModuleData **)0x0) {
LAB_001fe800:
          pcVar11 = 
          "void SmallArray<ModuleData *, 32>::push_back(const T &) [T = ModuleData *, N = 32]";
LAB_001fe82c:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,pcVar11);
        }
        pMVar8 = *ppMVar6;
        uVar1 = (moduleCtx->dependencies).count;
        (moduleCtx->dependencies).count = uVar1 + 1;
        ppMVar2[uVar1] = pMVar8;
      }
      uVar10 = uVar10 + 1;
      puVar9 = puVar9 + 7;
    } while (uVar10 < moduleBytecode->dependsCount);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void ImportModuleDependencies(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, ByteCode *moduleBytecode)
{
	TRACE_SCOPE("analyze", "ImportModuleDependencies");

	char *symbols = FindSymbols(moduleBytecode);

	ExternModuleInfo *moduleList = FindFirstModule(moduleBytecode);

	for(unsigned i = 0; i < moduleBytecode->dependsCount; i++)
	{
		ExternModuleInfo &moduleInfo = moduleList[i];

		const char *moduleFileName = symbols + moduleInfo.nameOffset;

		if(ModuleData **uniqueModuleData = ctx.uniqueDependencyMap.find(InplaceStr(moduleFileName)))
		{
			moduleCtx.dependencies.push_back(*uniqueModuleData);
			continue;
		}

		const char *bytecode = BinaryCache::FindBytecode(moduleFileName, false);

		if(!bytecode)
			Stop(ctx, source, "ERROR: module dependency import is not implemented");

		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::FindLexems(moduleFileName, false, lexStreamSize);

		ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, InplaceStr(moduleFileName));

		moduleCtx.dependencies.push_back(moduleData);

		ctx.uniqueDependencies.push_back(moduleData);
		ctx.uniqueDependencyMap.insert(InplaceStr(moduleFileName), moduleData);

		moduleData->bytecode = (ByteCode*)bytecode;

		if(!lexStream)
		{
			moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

			moduleData->lexer->Lexify(FindSource(moduleData->bytecode));
			lexStream = moduleData->lexer->GetStreamStart();
			lexStreamSize = moduleData->lexer->GetStreamSize();

			BinaryCache::PutLexemes(moduleFileName, lexStream, lexStreamSize);
		}

		moduleData->lexStream = lexStream;
		moduleData->lexStreamSize = lexStreamSize;
	}
}